

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int session_send_attach(LINK_ENDPOINT_HANDLE link_endpoint,ATTACH_HANDLE attach)

{
  int iVar1;
  AMQP_VALUE performative;
  undefined1 uVar2;
  undefined7 in_register_00000009;
  PAYLOAD *payloads;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  int iVar3;
  
  uVar2 = attach == (ATTACH_HANDLE)0x0 || link_endpoint == (LINK_ENDPOINT_HANDLE)0x0;
  iVar3 = 0x535;
  if (attach != (ATTACH_HANDLE)0x0 && link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    iVar1 = attach_set_handle(attach,link_endpoint->output_handle);
    iVar3 = 0x53d;
    if (iVar1 == 0) {
      performative = amqpvalue_create_attach(attach);
      if (performative == (AMQP_VALUE)0x0) {
        iVar3 = 0x544;
      }
      else {
        iVar1 = encode_frame(link_endpoint,performative,payloads,
                             CONCAT71(in_register_00000009,uVar2));
        iVar3 = 0x54a;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
        amqpvalue_destroy(performative);
      }
    }
  }
  return iVar3;
}

Assistant:

int session_send_attach(LINK_ENDPOINT_HANDLE link_endpoint, ATTACH_HANDLE attach)
{
    int result;

    if ((link_endpoint == NULL) ||
        (attach == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;

        if (attach_set_handle(attach, link_endpoint_instance->output_handle) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE attach_performative_value = amqpvalue_create_attach(attach);
            if (attach_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (encode_frame(link_endpoint, attach_performative_value, NULL, 0) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(attach_performative_value);
            }
        }
    }

    return result;
}